

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpip-forward.c
# Opt level: O2

int main(int argc,char **argv)

{
  uint __i;
  uint uVar1;
  int __fd;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  size_t sVar6;
  char *pcVar7;
  char *pcVar8;
  size_t sVar9;
  long lVar10;
  ssize_t sVar11;
  long lVar12;
  byte bVar13;
  long lVar14;
  char *pcVar15;
  FILE *__stream;
  ulong uVar16;
  bool bVar17;
  size_t sStack_4100;
  sockaddr_in sin;
  timeval tv;
  fd_set fds;
  char buf [16384];
  
  if ((1 < argc) && (server_ip = argv[1], argc != 2)) {
    username = argv[2];
    if ((3 < (uint)argc) &&
       ((((password = argv[3], argc != 4 && (remote_listenhost = argv[4], 5 < (uint)argc)) &&
         (remote_wantport = atoi(argv[5]), argc != 6)) && (local_destip = argv[6], 7 < (uint)argc)))
       ) {
      local_destport = atoi(argv[7]);
    }
  }
  uVar1 = libssh2_init(0);
  if (uVar1 != 0) {
    fprintf(_stderr,"libssh2 initialization failed (%d)\n",(ulong)uVar1);
    return 1;
  }
  __fd = socket(2,1,6);
  if (__fd == -1) {
    fwrite("failed to open socket.\n",0x17,1,_stderr);
    goto LAB_001014e2;
  }
  sin.sin_family = 2;
  sin.sin_addr.s_addr = inet_addr(server_ip);
  if (sin.sin_addr.s_addr == 0xffffffff) {
    pcVar15 = "inet_addr: Invalid IP address \'%s\'\n";
    pcVar7 = server_ip;
    __stream = _stderr;
LAB_001014ca:
    fprintf(__stream,pcVar15,pcVar7);
  }
  else {
    sin.sin_port = 0x1600;
    iVar2 = connect(__fd,(sockaddr *)&sin,0x10);
    __stream = _stderr;
    if (iVar2 != 0) {
      pcVar7 = inet_ntoa((in_addr)sin.sin_addr.s_addr);
      pcVar15 = "Failed to connect to %s.\n";
      goto LAB_001014ca;
    }
    lVar4 = libssh2_session_init_ex(0,0,0,0);
    if (lVar4 == 0) {
      fwrite("Could not initialize SSH session.\n",0x22,1,_stderr);
    }
    else {
      uVar1 = libssh2_session_handshake(lVar4,__fd);
      if (uVar1 == 0) {
        lVar5 = libssh2_hostkey_hash(lVar4,2);
        fwrite("Fingerprint: ",0xd,1,_stderr);
        for (lVar14 = 0; lVar14 != 0x14; lVar14 = lVar14 + 1) {
          fprintf(_stderr,"%02X ",(ulong)*(byte *)(lVar5 + lVar14));
        }
        fputc(10,_stderr);
        pcVar7 = username;
        sVar6 = strlen(username);
        pcVar7 = (char *)libssh2_userauth_list(lVar4,pcVar7,sVar6 & 0xffffffff);
        if (pcVar7 == (char *)0x0) {
LAB_001015bf:
          fprintf(_stderr,"Asking server to listen on remote %s:%d\n",remote_listenhost,
                  (ulong)(uint)remote_wantport);
          lVar5 = libssh2_channel_forward_listen_ex
                            (lVar4,remote_listenhost,remote_wantport,&remote_listenport,1);
          if (lVar5 == 0) {
            fwrite("Could not start the tcpip-forward listener.\n(Note that this can be a problem at the server. Please review the server logs.)\n"
                   ,0x7c,1,_stderr);
          }
          else {
            fprintf(_stderr,"Server is listening on %s:%d\n",remote_listenhost,
                    (ulong)(uint)remote_listenport);
            fwrite("Waiting for remote connection\n",0x1e,1,_stderr);
            lVar14 = libssh2_channel_forward_accept(lVar5);
            if (lVar14 == 0) {
              fwrite("Could not accept connection.\n(Note that this can be a problem at the server. Please review the server logs.)\n"
                     ,0x6d,1,_stderr);
            }
            else {
              fprintf(_stderr,"Accepted remote connection. Connecting to local server %s:%d\n",
                      local_destip,(ulong)(uint)local_destport);
              iVar2 = socket(2,1,6);
              if (iVar2 == -1) {
                fwrite("failed to open forward socket.\n",0x1f,1,_stderr);
              }
              else {
                sin.sin_family = 2;
                sin.sin_port = (ushort)local_destport << 8 | (ushort)local_destport >> 8;
                sin.sin_addr.s_addr = inet_addr(local_destip);
                if (sin.sin_addr.s_addr == 0xffffffff) {
                  pcVar7 = "failed in inet_addr().\n";
                  sStack_4100 = 0x17;
LAB_001018ff:
                  fwrite(pcVar7,sStack_4100,1,_stderr);
                }
                else {
                  iVar3 = connect(iVar2,(sockaddr *)&sin,0x10);
                  if (iVar3 == -1) {
                    pcVar7 = "failed to connect().\n";
                    sStack_4100 = 0x15;
                    goto LAB_001018ff;
                  }
                  fprintf(_stderr,"Forwarding connection from remote %s:%d to local %s:%d\n",
                          remote_listenhost,(ulong)(uint)remote_listenport,local_destip,
                          (ulong)(uint)local_destport);
                  libssh2_session_set_blocking(lVar4,0);
                  uVar16 = 1L << ((byte)iVar2 & 0x3f);
LAB_00101975:
                  for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 1) {
                    fds.__fds_bits[lVar10] = 0;
                  }
                  fds.__fds_bits[iVar2 / 0x40] = fds.__fds_bits[iVar2 / 0x40] | uVar16;
                  tv.tv_sec = 0;
                  tv.tv_usec = 100000;
                  iVar3 = select(iVar2 + 1,(fd_set *)&fds,(fd_set *)0x0,(fd_set *)0x0,(timeval *)&tv
                                );
                  if (iVar3 == 0) {
LAB_00101a68:
                    lVar12 = libssh2_channel_read_ex(lVar14,0,buf);
                    if (lVar12 != -0x25) {
                      if (-1 < lVar12) goto code_r0x00101a2f;
                      pcVar7 = "libssh2_channel_read: %ld";
LAB_00101b5b:
                      fprintf(_stderr,pcVar7,lVar12);
                      goto LAB_00101ac0;
                    }
                    goto LAB_00101975;
                  }
                  if (iVar3 == -1) {
                    pcVar7 = "failed to select().\n";
                    sStack_4100 = 0x14;
LAB_00101aae:
                    fwrite(pcVar7,sStack_4100,1,_stderr);
                  }
                  else {
                    if ((fds.__fds_bits[iVar2 / 0x40] & uVar16) == 0) goto LAB_00101a68;
                    sVar11 = recv(iVar2,buf,0x4000,0);
                    if (sVar11 < 0) {
                      pcVar7 = "failed to recv().\n";
LAB_00101aac:
                      sStack_4100 = 0x12;
                      goto LAB_00101aae;
                    }
                    if (sVar11 != 0) {
                      lVar10 = 0;
                      do {
                        lVar12 = libssh2_channel_write_ex(lVar14,0,buf,sVar11);
                        if (lVar12 < 0) {
                          pcVar7 = "libssh2_channel_write: %ld\n";
                          goto LAB_00101b5b;
                        }
                      } while ((lVar12 != 0) && (lVar10 = lVar10 + lVar12, lVar10 < sVar11));
                      goto LAB_00101a68;
                    }
                    pcVar15 = "The local server at %s:%d disconnected.\n";
                    pcVar7 = local_destip;
                    uVar1 = local_destport;
LAB_00101b3b:
                    fprintf(_stderr,pcVar15,pcVar7,(ulong)uVar1);
                  }
                }
LAB_00101ac0:
                shutdown(iVar2,2);
                close(iVar2);
              }
              libssh2_channel_free(lVar14);
            }
            libssh2_channel_forward_cancel(lVar5);
          }
        }
        else {
          fprintf(_stderr,"Authentication methods: %s\n",pcVar7);
          pcVar15 = strstr(pcVar7,"password");
          bVar17 = pcVar15 != (char *)0x0;
          pcVar8 = strstr(pcVar7,"publickey");
          pcVar7 = username;
          bVar13 = bVar17 + 2;
          if (pcVar8 == (char *)0x0) {
            bVar13 = bVar17;
          }
          if (8 < argc) {
            if (((pcVar15 != (char *)0x0) && (pcVar15 = argv[8], *pcVar15 == '-')) &&
               ((pcVar15[1] == 'p' && (pcVar15[2] == '\0')))) {
              bVar13 = 0;
              bVar17 = true;
            }
            if ((((bVar13 & 2) != 0) && (pcVar15 = argv[8], *pcVar15 == '-')) &&
               ((pcVar15[1] == 'k' && (pcVar15[2] == '\0')))) {
              bVar13 = 2;
              bVar17 = false;
            }
          }
          if (bVar17) {
            sVar6 = strlen(username);
            pcVar15 = password;
            sVar9 = strlen(password);
            iVar2 = libssh2_userauth_password_ex
                              (lVar4,pcVar7,sVar6 & 0xffffffff,pcVar15,sVar9 & 0xffffffff,0);
            if (iVar2 == 0) goto LAB_001015bf;
            fwrite("Authentication by password failed.\n",0x23,1,_stderr);
          }
          else {
            if ((bVar13 & 2) == 0) {
              pcVar7 = "No supported authentication methods found.\n";
              sStack_4100 = 0x2b;
            }
            else {
              sVar6 = strlen(username);
              iVar2 = libssh2_userauth_publickey_fromfile_ex
                                (lVar4,pcVar7,sVar6 & 0xffffffff,"/home/username/.ssh/id_rsa.pub",
                                 "/home/username/.ssh/id_rsa",password);
              if (iVar2 == 0) {
                fwrite("Authentication by public key succeeded.\n",0x28,1,_stderr);
                goto LAB_001015bf;
              }
              pcVar7 = "Authentication by public key failed.\n";
              sStack_4100 = 0x25;
            }
            fwrite(pcVar7,sStack_4100,1,_stderr);
          }
        }
      }
      else {
        fprintf(_stderr,"Error when starting up SSH session: %d\n",(ulong)uVar1);
      }
      libssh2_session_disconnect_ex(lVar4,0xb,"Normal Shutdown","");
      libssh2_session_free(lVar4);
    }
  }
  shutdown(__fd,2);
  close(__fd);
LAB_001014e2:
  libssh2_exit();
  return 0;
code_r0x00101a2f:
  lVar10 = 0;
  while (lVar12 - lVar10 != 0 && lVar10 <= lVar12) {
    sVar11 = send(iVar2,buf + lVar10,lVar12 - lVar10,0);
    lVar10 = lVar10 + sVar11;
    if (sVar11 < 1) {
      pcVar7 = "failed to send().\n";
      goto LAB_00101aac;
    }
  }
  iVar3 = libssh2_channel_eof(lVar14);
  if (iVar3 != 0) {
    pcVar15 = "The remote client at %s:%d disconnected.\n";
    pcVar7 = remote_listenhost;
    uVar1 = remote_listenport;
    goto LAB_00101b3b;
  }
  goto LAB_00101a68;
}

Assistant:

int main(int argc, char *argv[])
{
    int i, auth = AUTH_NONE;
    struct sockaddr_in sin;
    socklen_t sinlen = sizeof(sin);
    const char *fingerprint;
    char *userauthlist;
    int rc;
    LIBSSH2_SESSION *session = NULL;
    LIBSSH2_LISTENER *listener = NULL;
    LIBSSH2_CHANNEL *channel = NULL;
    struct timeval tv;
    ssize_t len, wr;
    char buf[16384];
    libssh2_socket_t sock;
    libssh2_socket_t forwardsock = LIBSSH2_INVALID_SOCKET;

#ifdef _WIN32
    WSADATA wsadata;

    rc = WSAStartup(MAKEWORD(2, 0), &wsadata);
    if(rc) {
        fprintf(stderr, "WSAStartup failed with error: %d\n", rc);
        return 1;
    }
#endif

    if(argc > 1)
        server_ip = argv[1];
    if(argc > 2)
        username = argv[2];
    if(argc > 3)
        password = argv[3];
    if(argc > 4)
        remote_listenhost = argv[4];
    if(argc > 5)
        remote_wantport = atoi(argv[5]);
    if(argc > 6)
        local_destip = argv[6];
    if(argc > 7)
        local_destport = atoi(argv[7]);

    rc = libssh2_init(0);
    if(rc) {
        fprintf(stderr, "libssh2 initialization failed (%d)\n", rc);
        return 1;
    }

    /* Connect to SSH server */
    sock = socket(PF_INET, SOCK_STREAM, IPPROTO_TCP);
    if(sock == LIBSSH2_INVALID_SOCKET) {
        fprintf(stderr, "failed to open socket.\n");
        goto shutdown;
    }

    sin.sin_family = AF_INET;
    sin.sin_addr.s_addr = inet_addr(server_ip);
    if(INADDR_NONE == sin.sin_addr.s_addr) {
        fprintf(stderr, "inet_addr: Invalid IP address '%s'\n", server_ip);
        goto shutdown;
    }
    sin.sin_port = htons(22);
    if(connect(sock, (struct sockaddr*)(&sin), sizeof(struct sockaddr_in))) {
        fprintf(stderr, "Failed to connect to %s.\n", inet_ntoa(sin.sin_addr));
        goto shutdown;
    }

    /* Create a session instance */
    session = libssh2_session_init();
    if(!session) {
        fprintf(stderr, "Could not initialize SSH session.\n");
        goto shutdown;
    }

    /* ... start it up. This will trade welcome banners, exchange keys,
     * and setup crypto, compression, and MAC layers
     */
    rc = libssh2_session_handshake(session, sock);
    if(rc) {
        fprintf(stderr, "Error when starting up SSH session: %d\n", rc);
        goto shutdown;
    }

    /* At this point we have not yet authenticated.  The first thing to do
     * is check the hostkey's fingerprint against our known hosts Your app
     * may have it hard coded, may go to a file, may present it to the
     * user, that's your call
     */
    fingerprint = libssh2_hostkey_hash(session, LIBSSH2_HOSTKEY_HASH_SHA1);
    fprintf(stderr, "Fingerprint: ");
    for(i = 0; i < 20; i++)
        fprintf(stderr, "%02X ", (unsigned char)fingerprint[i]);
    fprintf(stderr, "\n");

    /* check what authentication methods are available */
    userauthlist = libssh2_userauth_list(session, username,
                                         (unsigned int)strlen(username));
    if(userauthlist) {
        fprintf(stderr, "Authentication methods: %s\n", userauthlist);
        if(strstr(userauthlist, "password"))
            auth |= AUTH_PASSWORD;
        if(strstr(userauthlist, "publickey"))
            auth |= AUTH_PUBLICKEY;

        /* check for options */
        if(argc > 8) {
            if((auth & AUTH_PASSWORD) && !strcmp(argv[8], "-p"))
                auth = AUTH_PASSWORD;
            if((auth & AUTH_PUBLICKEY) && !strcmp(argv[8], "-k"))
                auth = AUTH_PUBLICKEY;
        }

        if(auth & AUTH_PASSWORD) {
            if(libssh2_userauth_password(session, username, password)) {
                fprintf(stderr, "Authentication by password failed.\n");
                goto shutdown;
            }
        }
        else if(auth & AUTH_PUBLICKEY) {
            if(libssh2_userauth_publickey_fromfile(session, username,
                                                   pubkey, privkey,
                                                   password)) {
                fprintf(stderr, "Authentication by public key failed.\n");
                goto shutdown;
            }
            else {
                fprintf(stderr, "Authentication by public key succeeded.\n");
            }
        }
        else {
            fprintf(stderr, "No supported authentication methods found.\n");
            goto shutdown;
        }
    }

    fprintf(stderr, "Asking server to listen on remote %s:%d\n",
            remote_listenhost, remote_wantport);

    listener = libssh2_channel_forward_listen_ex(session, remote_listenhost,
                                                 remote_wantport,
                                                 &remote_listenport, 1);
    if(!listener) {
        fprintf(stderr, "Could not start the tcpip-forward listener.\n"
                        "(Note that this can be a problem at the server."
                        " Please review the server logs.)\n");
        goto shutdown;
    }

    fprintf(stderr, "Server is listening on %s:%d\n", remote_listenhost,
            remote_listenport);

    fprintf(stderr, "Waiting for remote connection\n");
    channel = libssh2_channel_forward_accept(listener);
    if(!channel) {
        fprintf(stderr, "Could not accept connection.\n"
                        "(Note that this can be a problem at the server."
                        " Please review the server logs.)\n");
        goto shutdown;
    }

    fprintf(stderr,
            "Accepted remote connection. Connecting to local server %s:%d\n",
            local_destip, local_destport);
    forwardsock = socket(PF_INET, SOCK_STREAM, IPPROTO_TCP);
    if(forwardsock == LIBSSH2_INVALID_SOCKET) {
        fprintf(stderr, "failed to open forward socket.\n");
        goto shutdown;
    }

    sin.sin_family = AF_INET;
    sin.sin_port = htons((unsigned short)local_destport);
    sin.sin_addr.s_addr = inet_addr(local_destip);
    if(INADDR_NONE == sin.sin_addr.s_addr) {
        fprintf(stderr, "failed in inet_addr().\n");
        goto shutdown;
    }
    if(-1 == connect(forwardsock, (struct sockaddr *)&sin, sinlen)) {
        fprintf(stderr, "failed to connect().\n");
        goto shutdown;
    }

    fprintf(stderr, "Forwarding connection from remote %s:%d to local %s:%d\n",
            remote_listenhost, remote_listenport,
            local_destip, local_destport);

    /* Must use non-blocking IO hereafter due to the current libssh2 API */
    libssh2_session_set_blocking(session, 0);

    for(;;) {
        fd_set fds;
        FD_ZERO(&fds);
#if defined(__GNUC__) || defined(__clang__)
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wsign-conversion"
#endif
        FD_SET(forwardsock, &fds);
#if defined(__GNUC__) || defined(__clang__)
#pragma GCC diagnostic pop
#endif
        tv.tv_sec = 0;
        tv.tv_usec = 100000;
        rc = select((int)(forwardsock + 1), &fds, NULL, NULL, &tv);
        if(-1 == rc) {
            fprintf(stderr, "failed to select().\n");
            goto shutdown;
        }
#if defined(__GNUC__) || defined(__clang__)
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wsign-conversion"
#endif
        if(rc && FD_ISSET(forwardsock, &fds)) {
#if defined(__GNUC__) || defined(__clang__)
#pragma GCC diagnostic pop
#endif
            ssize_t nwritten;
            len = recv(forwardsock, buf, sizeof(buf), 0);
            if(len < 0) {
                fprintf(stderr, "failed to recv().\n");
                goto shutdown;
            }
            else if(len == 0) {
                fprintf(stderr, "The local server at %s:%d disconnected.\n",
                        local_destip, local_destport);
                goto shutdown;
            }
            wr = 0;
            do {
                nwritten = libssh2_channel_write(channel, buf, (size_t)len);
                if(nwritten < 0) {
                    fprintf(stderr, "libssh2_channel_write: %ld\n",
                            (long)nwritten);
                    goto shutdown;
                }
                wr += nwritten;
            } while(nwritten > 0 && wr < len);
        }
        for(;;) {
            ssize_t nsent;
            len = libssh2_channel_read(channel, buf, sizeof(buf));
            if(LIBSSH2_ERROR_EAGAIN == len)
                break;
            else if(len < 0) {
                fprintf(stderr, "libssh2_channel_read: %ld",
                        (long)len);
                goto shutdown;
            }
            wr = 0;
            while(wr < len) {
                nsent = send(forwardsock, buf + wr, (size_t)(len - wr), 0);
                if(nsent <= 0) {
                    fprintf(stderr, "failed to send().\n");
                    goto shutdown;
                }
                wr += nsent;
            }
            if(libssh2_channel_eof(channel)) {
                fprintf(stderr, "The remote client at %s:%d disconnected.\n",
                        remote_listenhost, remote_listenport);
                goto shutdown;
            }
        }
    }

shutdown:

    if(forwardsock != LIBSSH2_INVALID_SOCKET) {
        shutdown(forwardsock, 2);
        LIBSSH2_SOCKET_CLOSE(forwardsock);
    }

    if(channel)
        libssh2_channel_free(channel);

    if(listener)
        libssh2_channel_forward_cancel(listener);

    if(session) {
        libssh2_session_disconnect(session, "Normal Shutdown");
        libssh2_session_free(session);
    }

    if(sock != LIBSSH2_INVALID_SOCKET) {
        shutdown(sock, 2);
        LIBSSH2_SOCKET_CLOSE(sock);
    }

    libssh2_exit();

#ifdef _WIN32
    WSACleanup();
#endif

    return 0;
}